

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes SzArEx_Open(CSzArEx *p,ILookInStream *inStream,ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  Byte *pBVar1;
  Byte *pBVar2;
  SRes SVar3;
  SRes SVar4;
  UInt32 UVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  UInt64 type;
  Int64 startArcPos;
  CBuf buf;
  CBuf tempBuf;
  CSzData sd;
  Byte header [32];
  Int64 pos;
  UInt64 local_f0;
  Int64 local_e8;
  UInt32 local_dc;
  CBuf local_d8;
  CBuf local_c8;
  CSzData local_b8;
  Byte local_a8 [6];
  char local_a2;
  UInt32 local_a0;
  ulong local_9c;
  size_t local_94;
  UInt32 local_8c;
  CSzAr local_88;
  
  local_e8 = 0;
  SVar3 = (*inStream->Seek)(inStream,&local_e8,SZ_SEEK_CUR);
  SVar4 = SVar3;
  if ((SVar3 == 0) && (SVar4 = LookInStream_Read2(inStream,local_a8,0x20,0x11), SVar4 == 0)) {
    lVar7 = 0;
    do {
      pBVar2 = local_a8 + lVar7;
      pBVar1 = k7zSignature + lVar7;
      if (*pBVar2 != *pBVar1) break;
      bVar10 = lVar7 != 5;
      lVar7 = lVar7 + 1;
    } while (bVar10);
    SVar4 = 0x11;
    if ((*pBVar2 == *pBVar1) && (SVar4 = 4, local_a2 == '\0')) {
      local_dc = local_8c;
      p->startPosAfterHeader = local_e8 + 0x20;
      UVar5 = CrcCalc(&local_9c,0x14);
      SVar4 = 3;
      if (UVar5 == local_a0) {
        if (local_94 == 0) {
          SVar4 = 0;
        }
        else {
          SVar4 = 0x11;
          if (local_9c <= -local_94 - 0x21 && !CARRY8(local_9c,local_94)) {
            local_88.NumPackStreams = 0;
            local_88.NumFolders = 0;
            SVar4 = (*inStream->Seek)(inStream,(Int64 *)&local_88,SZ_SEEK_END);
            if (SVar4 == 0) {
              if ((ulong)local_88._0_8_ < local_e8 + local_9c) {
                bVar10 = false;
                SVar4 = 6;
              }
              else {
                bVar8 = local_e8 + local_9c + 0x20 <= (ulong)local_88._0_8_;
                bVar9 = local_e8 + local_9c + local_94 + 0x20 <= (ulong)local_88._0_8_;
                bVar10 = bVar9 && bVar8;
                SVar4 = SVar3;
                if (!bVar9 || !bVar8) {
                  SVar4 = 6;
                }
              }
            }
            else {
              bVar10 = false;
            }
            if ((bVar10) &&
               (SVar4 = LookInStream_SeekTo(inStream,local_9c + local_e8 + 0x20), SVar4 == 0)) {
              iVar6 = Buf_Create(&local_d8,local_94,allocTemp);
              if (iVar6 == 0) {
                SVar4 = 2;
              }
              else {
                SVar4 = LookInStream_Read(inStream,local_d8.data,local_94);
                if (SVar4 == 0) {
                  UVar5 = CrcCalc(local_d8.data,local_94);
                  SVar4 = 0x10;
                  if (UVar5 == local_dc) {
                    local_b8.Data = local_d8.data;
                    local_b8.Size = local_d8.size;
                    SVar4 = ReadNumber(&local_b8,&local_f0);
                    if ((SVar4 == 0) && (local_f0 == 0x17)) {
                      Buf_Init(&local_c8);
                      local_88.CoderUnpackSizes = (UInt64 *)0x0;
                      local_88.CodersData = (Byte *)0x0;
                      local_88.FoToCoderUnpackSizes = (UInt32 *)0x0;
                      local_88.FoToMainUnpackSizeIndex = (Byte *)0x0;
                      local_88.FoCodersOffsets = (size_t *)0x0;
                      local_88.FoStartPackStreamIndex = (UInt32 *)0x0;
                      local_88.FolderCRCs.Defs = (Byte *)0x0;
                      local_88.FolderCRCs.Vals = (UInt32 *)0x0;
                      local_88.NumPackStreams = 0;
                      local_88.NumFolders = 0;
                      local_88.PackPositions = (UInt64 *)0x0;
                      SVar4 = SzReadAndDecodePackedStreams
                                        (inStream,&local_b8,&local_c8,1,p->startPosAfterHeader,
                                         &local_88,allocTemp);
                      SzAr_Free(&local_88,allocTemp);
                      if (SVar4 == 0) {
                        Buf_Free(&local_d8,allocTemp);
                        local_d8.data = local_c8.data;
                        local_d8.size = local_c8.size;
                        local_b8.Data = local_c8.data;
                        local_b8.Size = local_c8.size;
                        SVar4 = ReadNumber(&local_b8,&local_f0);
                      }
                      else {
                        Buf_Free(&local_c8,allocTemp);
                      }
                    }
                    if ((SVar4 == 0) && (SVar4 = 4, local_f0 == 1)) {
                      SVar4 = SzReadHeader(p,&local_b8,inStream,allocMain,allocTemp);
                    }
                  }
                }
                Buf_Free(&local_d8,allocTemp);
              }
            }
          }
        }
      }
    }
  }
  if (SVar4 != 0) {
    SzArEx_Free(p,allocMain);
  }
  return SVar4;
}

Assistant:

SRes SzArEx_Open(CSzArEx *p, ILookInStream *inStream,
    ISzAlloc *allocMain, ISzAlloc *allocTemp)
{
  SRes res = SzArEx_Open2(p, inStream, allocMain, allocTemp);
  if (res != SZ_OK)
    SzArEx_Free(p, allocMain);
  return res;
}